

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

void __thiscall r_exec::TDecompiler::runDecompiler(TDecompiler *this)

{
  thread *this_00;
  undefined1 local_48 [16];
  undefined1 local_38 [40];
  
  if (this->metadata == (Metadata *)0x0) {
    std::__cxx11::string::string((string *)(local_38 + 8),"tdecompiler",(allocator *)local_38);
    ::debug((string *)local_48);
    DebugStream::operator<<((DebugStream *)local_48,"unable to run without metadata");
    DebugStream::~DebugStream((DebugStream *)local_48);
    std::__cxx11::string::~string((string *)(local_38 + 8));
  }
  else {
    this_00 = (thread *)operator_new(8);
    local_48._0_8_ = decompile;
    local_48._8_8_ = 0;
    local_38._0_8_ = this;
    std::thread::thread<void(r_exec::TDecompiler::*)(),r_exec::TDecompiler*,void>
              (this_00,(type *)local_48,(TDecompiler **)local_38);
    this->_thread = this_00;
  }
  return;
}

Assistant:

void TDecompiler::runDecompiler()
{
    if (!metadata) {
        debug("tdecompiler") << "unable to run without metadata";
        return;
    }

    _thread = new std::thread(&r_exec::TDecompiler::decompile, this);
}